

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSamplerStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::SamplerStateQueryTests::init
          (SamplerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  char *pcVar2;
  bool bVar3;
  TestNode *pTVar4;
  ulong extraout_RAX;
  RenderContext *pRVar5;
  TestNode *pTVar6;
  ulong uVar7;
  TesterType local_350;
  TesterType local_34c;
  allocator<char> local_269;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  TesterType local_208;
  int local_204;
  TesterType tester;
  int stateNdx_1;
  TestCaseGroup *targetGroup_1;
  int setterNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  QueryType local_16c;
  char *pcStack_168;
  QueryType verifier_2;
  char *verifierSuffix_2;
  int verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  QueryType local_d4;
  char *pcStack_d0;
  QueryType verifier_1;
  char *verifierSuffix_1;
  int verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  QueryType local_3c;
  char *pcStack_38;
  QueryType verifier;
  char *verifierSuffix;
  uint local_28;
  int verifierNdx;
  int stateNdx;
  TestNode *local_18;
  TestCaseGroup *targetGroup;
  SamplerStateQueryTests *this_local;
  
  targetGroup = (TestCaseGroup *)this;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"set_value",
             "Set value and query it");
  local_18 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  local_28 = 0;
  uVar7 = extraout_RAX;
  while ((int)local_28 < 0xe) {
    if ((init::states[(int)local_28].newInGLES31 & 1U) != 0) {
      bVar3 = isExtendedParamQuery(init::states[(int)local_28].tester);
      if (bVar3) {
        for (verifierSuffix._4_4_ = 0; verifierSuffix._4_4_ < 2;
            verifierSuffix._4_4_ = verifierSuffix._4_4_ + 1) {
          pcStack_38 = getVerifierSuffix(init::nonPureVerifiers[verifierSuffix._4_4_]);
          pTVar4 = local_18;
          local_3c = init::nonPureVerifiers[verifierSuffix._4_4_];
          pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
          std::__cxx11::string::string((string *)&local_a0);
          std::operator+(&local_80,&local_a0,init::states[(int)local_28].name);
          std::operator+(&local_60,&local_80,pcStack_38);
          pcVar2 = init::states[(int)local_28].desc;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&verifierNdx_1,pcVar2,
                     (allocator<char> *)((long)&verifierSuffix_1 + 7));
          pTVar6 = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                              (pTVar1,pRVar5,&local_60,(string *)&verifierNdx_1,local_3c,
                               init::states[(int)local_28].tester)->super_TestNode;
          tcu::TestNode::addChild(pTVar4,pTVar6);
          std::__cxx11::string::~string((string *)&verifierNdx_1);
          std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_1 + 7));
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
        }
      }
      else {
        bVar3 = isIsVectorQuery(init::states[(int)local_28].tester);
        if (bVar3) {
          for (verifierSuffix_1._0_4_ = 0; (int)verifierSuffix_1 < 4;
              verifierSuffix_1._0_4_ = (int)verifierSuffix_1 + 1) {
            pcStack_d0 = getVerifierSuffix(init::vectorVerifiers[(int)verifierSuffix_1]);
            pTVar4 = local_18;
            local_d4 = init::vectorVerifiers[(int)verifierSuffix_1];
            pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            std::__cxx11::string::string((string *)&local_138);
            std::operator+(&local_118,&local_138,init::states[(int)local_28].name);
            std::operator+(&local_f8,&local_118,pcStack_d0);
            pcVar2 = init::states[(int)local_28].desc;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&verifierNdx_2,pcVar2,
                       (allocator<char> *)((long)&verifierSuffix_2 + 7));
            pTVar6 = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                                (pTVar1,pRVar5,&local_f8,(string *)&verifierNdx_2,local_d4,
                                 init::states[(int)local_28].tester)->super_TestNode;
            tcu::TestNode::addChild(pTVar4,pTVar6);
            std::__cxx11::string::~string((string *)&verifierNdx_2);
            std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_2 + 7));
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_138);
          }
        }
        else {
          for (verifierSuffix_2._0_4_ = 0; (int)verifierSuffix_2 < 4;
              verifierSuffix_2._0_4_ = (int)verifierSuffix_2 + 1) {
            pcStack_168 = getVerifierSuffix(init::scalarVerifiers[(int)verifierSuffix_2]);
            pTVar4 = local_18;
            local_16c = init::scalarVerifiers[(int)verifierSuffix_2];
            pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            std::__cxx11::string::string((string *)&local_1d0);
            std::operator+(&local_1b0,&local_1d0,init::states[(int)local_28].name);
            std::operator+(&local_190,&local_1b0,pcStack_168);
            pcVar2 = init::states[(int)local_28].desc;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&setterNdx,pcVar2,(allocator<char> *)((long)&targetGroup_1 + 7));
            pTVar6 = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                                (pTVar1,pRVar5,&local_190,(string *)&setterNdx,local_16c,
                                 init::states[(int)local_28].tester)->super_TestNode;
            tcu::TestNode::addChild(pTVar4,pTVar6);
            std::__cxx11::string::~string((string *)&setterNdx);
            std::allocator<char>::~allocator((allocator<char> *)((long)&targetGroup_1 + 7));
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1d0);
          }
        }
      }
    }
    local_28 = local_28 + 1;
    uVar7 = (ulong)local_28;
  }
  targetGroup_1._0_4_ = 0;
  while ((int)(uint)targetGroup_1 < 2) {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::pureSetters[(int)(uint)targetGroup_1].name,
               init::pureSetters[(int)(uint)targetGroup_1].desc);
    _tester = pTVar4;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    for (local_204 = 0; pTVar4 = _tester, local_204 < 10; local_204 = local_204 + 1) {
      if (init::pureSetters[(int)(uint)targetGroup_1].verifier == QUERY_SAMPLER_PARAM_PURE_INTEGER)
      {
        local_34c = init::pureStates[local_204].intTester;
      }
      else {
        if (init::pureSetters[(int)(uint)targetGroup_1].verifier ==
            QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER) {
          local_350 = init::pureStates[local_204].uintTester;
        }
        else {
          local_350 = TESTER_LAST;
        }
        local_34c = local_350;
      }
      local_208 = local_34c;
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::__cxx11::string::string((string *)&local_248);
      std::operator+(&local_228,&local_248,init::pureStates[local_204].name);
      pcVar2 = init::pureStates[local_204].desc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,pcVar2,&local_269);
      pTVar6 = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                          (pTVar1,pRVar5,&local_228,&local_268,
                           init::pureSetters[(int)(uint)targetGroup_1].verifier,local_208)->
                super_TestNode;
      tcu::TestNode::addChild(pTVar4,pTVar6);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
    }
    targetGroup_1._0_4_ = (uint)targetGroup_1 + 1;
    uVar7 = (ulong)(uint)targetGroup_1;
  }
  return (int)uVar7;
}

Assistant:

void SamplerStateQueryTests::init (void)
{
	using namespace gls::TextureStateQueryTests;

	static const QueryType scalarVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT,
		QUERY_SAMPLER_PARAM_PURE_INTEGER,
		QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER,
	};
	static const QueryType nonPureVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT,
	};
	static const QueryType vectorVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER_VEC4,
		QUERY_SAMPLER_PARAM_FLOAT_VEC4,
		QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4,
		QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4,
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		targetGroup->addChild(X);															\
	}

	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
		bool		newInGLES31;
	} states[] =
	{
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S,					false	},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T,					false	},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R,					false	},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER,				false	},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER,				false	},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD,					false	},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD,					false	},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE,			false	},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC,			false	},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT,			true	},
		{ "texture_border_color",			"TEXTURE_BORDER_COLOR",				TESTER_TEXTURE_BORDER_COLOR,			true	},
		{ "texture_wrap_s_clamp_to_border",	"TEXTURE_WRAP_S_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_t_clamp_to_border",	"TEXTURE_WRAP_T_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_r_clamp_to_border",	"TEXTURE_WRAP_R_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER,	true	},
	};
	static const struct
	{
		const char* name;
		const char* desc;
		QueryType	verifier;
	} pureSetters[] =
	{
		{ "set_pure_int",	"Set state with pure int",			QUERY_SAMPLER_PARAM_PURE_INTEGER			},
		{ "set_pure_uint",	"Set state with pure unsigned int",	QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER	},
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	intTester;
		TesterType	uintTester;
	} pureStates[] =
	{
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S_SET_PURE_INT,				TESTER_TEXTURE_WRAP_S_SET_PURE_UINT					},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T_SET_PURE_INT,				TESTER_TEXTURE_WRAP_T_SET_PURE_UINT					},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R_SET_PURE_INT,				TESTER_TEXTURE_WRAP_R_SET_PURE_UINT					},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT				},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT				},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD_SET_PURE_INT,			TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT				},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD_SET_PURE_INT,			TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT				},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT			},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT			},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT,	TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT		},
		// \note texture_border_color is already checked
		// \note texture_wrap_*_clamp_to_border brings no additional coverage
	};

	// set_value
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, "set_value", "Set value and query it");
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
		{
			// already tested in gles3
			if (!states[stateNdx].newInGLES31)
				continue;

			if (isExtendedParamQuery(states[stateNdx].tester))
			{
				// no need to cover for all getters if the only thing new is the param name
				FOR_EACH_VERIFIER(nonPureVerifiers, createSamplerParamTest(m_testCtx,
																		   m_context.getRenderContext(),
																		   std::string() + states[stateNdx].name + verifierSuffix,
																		   states[stateNdx].desc,
																		   verifier,
																		   states[stateNdx].tester));
			}
			else if (isIsVectorQuery(states[stateNdx].tester))
			{
				FOR_EACH_VERIFIER(vectorVerifiers, createSamplerParamTest(m_testCtx,
																		  m_context.getRenderContext(),
																		  std::string() + states[stateNdx].name + verifierSuffix,
																		  states[stateNdx].desc,
																		  verifier,
																		  states[stateNdx].tester));
			}
			else
			{
				FOR_EACH_VERIFIER(scalarVerifiers, createSamplerParamTest(m_testCtx,
																		  m_context.getRenderContext(),
																		  std::string() + states[stateNdx].name + verifierSuffix,
																		  states[stateNdx].desc,
																		  verifier,
																		  states[stateNdx].tester));
			}
		}
	}

#undef FOR_EACH_VERIFIER

	// set_pure_uint
	// set_pure_int
	for (int setterNdx = 0; setterNdx < DE_LENGTH_OF_ARRAY(pureSetters); ++setterNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, pureSetters[setterNdx].name, pureSetters[setterNdx].desc);
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(pureStates); ++stateNdx)
		{
			const TesterType	tester	= (pureSetters[setterNdx].verifier == QUERY_SAMPLER_PARAM_PURE_INTEGER)				? (pureStates[stateNdx].intTester)
										: (pureSetters[setterNdx].verifier == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER)	? (pureStates[stateNdx].uintTester)
										: (TESTER_LAST);

			targetGroup->addChild(createSamplerParamTest(m_testCtx,
														 m_context.getRenderContext(),
														 std::string() + pureStates[stateNdx].name,
														 pureStates[stateNdx].desc,
														 pureSetters[setterNdx].verifier,
														 tester));
		}
	}
}